

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  bool bVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImRect IVar4;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = FindWindowByName(name);
  if ((pIVar3 == (ImGuiWindow *)0x0) || (pIVar3->BeginCount == 0)) {
    if (viewport_p == (ImGuiViewport *)0x0) {
      viewport_p = GetMainViewport();
    }
    IVar4 = ImGuiViewportP::GetBuildWorkRect((ImGuiViewportP *)viewport_p);
    pos = IVar4.Min;
    local_40 = IVar4.Max;
    uVar2 = dir & 0xfffffffe;
    if ((dir | 2U) == 3) {
      (&pos.x)[uVar2 == 2] = (&local_40.x)[uVar2 == 2] - axis_size;
    }
    bVar1 = uVar2 == 2;
    size.x = IVar4.Max.x - IVar4.Min.x;
    size.y = IVar4.Max.y - IVar4.Min.y;
    (&size.x)[bVar1] = axis_size;
    local_38.x = 0.0;
    local_38.y = 0.0;
    SetNextWindowPos(&pos,0,&local_38);
    SetNextWindowSize(&size,0);
    if ((dir & 0xfffffffdU) == 0) {
      (&((ImVec2 *)(&((ImGuiViewportP *)viewport_p)->DrawDataBuilder + 1))[2].x)[bVar1] =
           axis_size +
           (&((ImVec2 *)(&((ImGuiViewportP *)viewport_p)->DrawDataBuilder + 1))[2].x)[bVar1];
    }
    else if ((dir | 2U) == 3) {
      (&((ImVec2 *)(&((ImGuiViewportP *)viewport_p)->DrawDataBuilder + 1))[3].x)[bVar1] =
           (&((ImVec2 *)(&((ImGuiViewportP *)viewport_p)->DrawDataBuilder + 1))[3].x)[bVar1] -
           axis_size;
    }
  }
  PushStyleVar(3,0.0);
  local_48.x = 0.0;
  local_48.y = 0.0;
  PushStyleVar(5,&local_48);
  bVar1 = Begin(name,(bool *)0x0,window_flags | 7);
  PopStyleVar(2);
  return bVar1;
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}